

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O1

int Kit_GraphToGiaInternal(Gia_Man_t *pMan,Kit_Graph_t *pGraph,int fHash)

{
  Kit_Edge_t KVar1;
  int iVar2;
  Kit_Node_t *pKVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  Gia_Obj_t *pGVar8;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint iLit1;
  uint iLit0;
  uint uVar18;
  
  KVar1 = pGraph->eRoot;
  if (pGraph->fConst == 0) {
    uVar5 = (uint)KVar1 >> 1 & 0x3fffffff;
    lVar17 = (long)pGraph->nLeaves;
    if (uVar5 < (uint)pGraph->nLeaves) {
      uVar5 = pGraph->pNodes[uVar5].field_2.iFunc;
      if ((int)uVar5 < 0) {
LAB_005586c8:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = uVar5 ^ (uint)KVar1 & 1;
    }
    else {
      lVar7 = lVar17 * 0x18 + 8;
      do {
        lVar15 = lVar7;
        pKVar3 = pGraph->pNodes;
        uVar5 = *(uint *)((long)pKVar3 + lVar15 + -8);
        uVar18 = pKVar3[uVar5 >> 1 & 0x3fffffff].field_2.iFunc;
        if ((int)uVar18 < 0) goto LAB_005586c8;
        uVar11 = *(uint *)((long)pKVar3 + lVar15 + -4);
        uVar14 = pKVar3[uVar11 >> 1 & 0x3fffffff].field_2.iFunc;
        if ((int)uVar14 < 0) goto LAB_005586c8;
        uVar5 = uVar5 & 1;
        iLit0 = uVar5 ^ uVar18;
        uVar11 = uVar11 & 1;
        iLit1 = uVar11 ^ uVar14;
        if (fHash == 0) {
          if (pMan->fGiaSimple == 0) {
            uVar6 = iLit1;
            if ((int)iLit0 < 2) {
              if (uVar5 == uVar18) {
                uVar6 = 0;
              }
            }
            else if ((int)iLit1 < 2) {
              uVar6 = iLit0;
              if (uVar11 == uVar14) {
                uVar6 = 0;
              }
            }
            else if ((iLit0 != iLit1) && (uVar6 = 0, (iLit1 ^ iLit0) != 1)) goto LAB_005582bb;
          }
          else {
LAB_005582bb:
            uVar5 = pMan->nObjs;
            uVar11 = pMan->nObjsAlloc;
            if (uVar5 == uVar11) {
              uVar6 = uVar11 * 2;
              if (0x1fffffff < (int)(uVar11 * 2)) {
                uVar6 = 0x20000000;
              }
              if (uVar5 == 0x20000000) {
                puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
                exit(1);
              }
              if ((int)uVar6 <= (int)uVar5) {
                __assert_fail("p->nObjs < nObjNew",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x25f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
              }
              if (pMan->fVerbose != 0) {
                printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar11,(ulong)uVar6);
              }
              if (pMan->nObjsAlloc < 1) {
                __assert_fail("p->nObjsAlloc > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x262,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
              }
              lVar7 = (long)(int)uVar6;
              if (pMan->pObjs == (Gia_Obj_t *)0x0) {
                pGVar8 = (Gia_Obj_t *)malloc(lVar7 * 0xc);
              }
              else {
                pGVar8 = (Gia_Obj_t *)realloc(pMan->pObjs,lVar7 * 0xc);
              }
              pMan->pObjs = pGVar8;
              memset(pGVar8 + pMan->nObjsAlloc,0,(lVar7 - pMan->nObjsAlloc) * 0xc);
              if (pMan->pMuxes != (uint *)0x0) {
                puVar9 = (uint *)realloc(pMan->pMuxes,lVar7 * 4);
                pMan->pMuxes = puVar9;
                memset(puVar9 + pMan->nObjsAlloc,0,(lVar7 - pMan->nObjsAlloc) * 4);
              }
              pMan->nObjsAlloc = uVar6;
            }
            iVar2 = pMan->nObjs;
            pMan->nObjs = iVar2 + 1;
            if ((long)iVar2 < 0) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar18 = uVar18 >> 1;
            if (iVar2 < (int)uVar18) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x27a,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar14 = uVar14 >> 1;
            if (iVar2 < (int)uVar14) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x27b,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            pGVar8 = pMan->pObjs + iVar2;
            if ((uVar18 == uVar14) && (pMan->fGiaSimple == 0)) {
              __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x27c,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar5 = iVar2 - uVar18 & 0x1fffffff;
            uVar10 = *(ulong *)pGVar8;
            if ((int)iLit0 < (int)iLit1) {
              uVar13 = (ulong)(uVar5 | (iLit0 & 1) << 0x1d);
              *(ulong *)pGVar8 = uVar13 | uVar10 & 0xffffffffc0000000;
              pGVar4 = pMan->pObjs;
              if ((pGVar8 < pGVar4) || (pGVar4 + pMan->nObjs <= pGVar8)) goto LAB_005586e7;
              uVar12 = (ulong)(((uint)((int)pGVar8 - (int)pGVar4) >> 2) * -0x55555555 - uVar14 &
                              0x1fffffff) << 0x20;
              *(ulong *)pGVar8 = uVar13 | uVar10 & 0xe0000000c0000000 | uVar12;
              uVar10 = uVar13 | uVar10 & 0xc0000000c0000000 | uVar12 | (ulong)(iLit1 & 1) << 0x3d;
            }
            else {
              uVar13 = (ulong)uVar5 << 0x20;
              uVar12 = (ulong)(iLit0 & 1) << 0x3d;
              *(ulong *)pGVar8 = uVar12 | uVar10 & 0xc0000000ffffffff | uVar13;
              pGVar4 = pMan->pObjs;
              if ((pGVar8 < pGVar4) || (pGVar4 + pMan->nObjs <= pGVar8)) goto LAB_005586e7;
              uVar16 = (ulong)(((uint)((int)pGVar8 - (int)pGVar4) >> 2) * -0x55555555 - uVar14 &
                              0x1fffffff);
              *(ulong *)pGVar8 = uVar12 | uVar10 & 0xc0000000e0000000 | uVar13 | uVar16;
              uVar10 = uVar12 | uVar10 & 0xc0000000c0000000 | uVar13 | uVar16 |
                       (ulong)((iLit1 & 1) << 0x1d);
            }
            *(ulong *)pGVar8 = uVar10;
            if (pMan->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(pMan,pGVar8 + -(uVar10 & 0x1fffffff),pGVar8);
              Gia_ObjAddFanout(pMan,pGVar8 + -((ulong)*(uint *)&pGVar8->field_0x4 & 0x1fffffff),
                               pGVar8);
            }
            if (pMan->fSweeper != 0) {
              uVar13 = *(ulong *)pGVar8 & 0x1fffffff;
              uVar10 = *(ulong *)pGVar8 >> 0x20 & 0x1fffffff;
              uVar12 = 0x4000000000000000;
              if (((uint)*(ulong *)(pGVar8 + -uVar13) >> 0x1e & 1) == 0) {
                uVar12 = 0x40000000;
              }
              *(ulong *)(pGVar8 + -uVar13) = uVar12 | *(ulong *)(pGVar8 + -uVar13);
              uVar12 = *(ulong *)(pGVar8 + -uVar10);
              uVar16 = 0x4000000000000000;
              if (((uint)uVar12 >> 0x1e & 1) == 0) {
                uVar16 = 0x40000000;
              }
              *(ulong *)(pGVar8 + -uVar10) = uVar16 | uVar12;
              uVar10 = *(ulong *)pGVar8;
              *(ulong *)pGVar8 =
                   uVar10 & 0x7fffffffffffffff |
                   (ulong)(((uint)(uVar10 >> 0x3d) ^ (uint)(uVar12 >> 0x3f)) &
                          ((uint)((ulong)*(undefined8 *)(pGVar8 + -uVar13) >> 0x3f) ^
                          (uint)(uVar10 >> 0x1d) & 7)) << 0x3f;
            }
            pGVar4 = pMan->pObjs;
            if ((pGVar8 < pGVar4) || (pGVar4 + pMan->nObjs <= pGVar8)) {
LAB_005586e7:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar6 = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
          }
        }
        else {
          uVar6 = Gia_ManHashAnd(pMan,iLit0,iLit1);
        }
        *(uint *)(&(pKVar3->eEdge0).field_0x0 + lVar15) = uVar6;
        lVar17 = lVar17 + 1;
        lVar7 = lVar15 + 0x18;
      } while (lVar17 < pGraph->nSize);
      uVar5 = *(uint *)(&(pKVar3->eEdge0).field_0x0 + lVar15);
      if ((int)uVar5 < 0) goto LAB_005586c8;
      uVar5 = (uint)pGraph->eRoot & 1 ^ uVar5;
    }
  }
  else {
    uVar5 = ~(uint)KVar1 & 1;
  }
  return uVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Kit_GraphToGiaInternal( Gia_Man_t * pMan, Kit_Graph_t * pGraph, int fHash )
{
    Kit_Node_t * pNode = NULL;
    int i, pAnd0, pAnd1;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Kit_GraphVar(pGraph)->iFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        if ( fHash )
            pNode->iFunc = Gia_ManHashAnd( pMan, pAnd0, pAnd1 );
        else
            pNode->iFunc = Gia_ManAppendAnd2( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Kit_GraphIsComplement(pGraph) );
}